

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O1

void __thiscall
LRGrammaticalAnalyzer::PrintStack
          (LRGrammaticalAnalyzer *this,vector<quadraple,_std::allocator<quadraple>_> *token,int pos,
          stack<int,_std::deque<int,_std::allocator<int>_>_> *stateid,
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *symbol)

{
  uint uVar1;
  long lVar2;
  pointer pcVar3;
  uint __val;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint uVar4;
  uint uVar5;
  _Elt_pointer piVar6;
  long *plVar7;
  pointer pqVar8;
  _Elt_pointer pbVar9;
  ostream *poVar10;
  ulong uVar11;
  long *plVar12;
  uint __len;
  long lVar13;
  ulong uVar14;
  string sym;
  string __str;
  string tk;
  string st;
  ofstream analyzeout;
  char *local_2b8;
  long local_2b0;
  char local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_278;
  char *local_270;
  long local_268;
  char local_260 [16];
  char *local_250;
  long local_248;
  char local_240 [16];
  long *local_230;
  long local_228;
  long local_220;
  long alStack_218 [28];
  ios_base local_138 [264];
  
  local_250 = local_240;
  local_248 = 0;
  local_240[0] = '\0';
  local_270 = local_260;
  local_268 = 0;
  local_260[0] = '\0';
  local_2b8 = local_2a8;
  local_2b0 = 0;
  local_2a8[0] = '\0';
  piVar6 = (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  local_278 = symbol;
  if (piVar6 != (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    do {
      if (piVar6 == (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        piVar6 = (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      uVar1 = piVar6[-1];
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar11 = (ulong)__val;
        uVar4 = 4;
        do {
          __len = uVar4;
          uVar5 = (uint)uVar11;
          if (uVar5 < 100) {
            __len = __len - 2;
            goto LAB_0011ce33;
          }
          if (uVar5 < 1000) {
            __len = __len - 1;
            goto LAB_0011ce33;
          }
          if (uVar5 < 10000) goto LAB_0011ce33;
          uVar11 = uVar11 / 10000;
          uVar4 = __len + 4;
        } while (99999 < uVar5);
        __len = __len + 1;
      }
LAB_0011ce33:
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct((ulong)local_298,(char)__len - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_298[0] + (uVar1 >> 0x1f),__len,__val);
      plVar7 = (long *)std::__cxx11::string::append((char *)local_298);
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_220 = *plVar12;
        alStack_218[0] = plVar7[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *plVar12;
        local_230 = (long *)*plVar7;
      }
      local_228 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230);
      }
      if (local_298[0] != local_288) {
        operator_delete(local_298[0]);
      }
      std::deque<int,_std::allocator<int>_>::pop_back(&stateid->c);
      piVar6 = (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    } while (piVar6 != (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur);
  }
  this_00 = local_278;
  uVar14 = (ulong)pos;
  pqVar8 = (token->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = ((long)(token->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pqVar8 >> 3) * -0x71c71c71c71c71c7;
  if (uVar14 <= uVar11 && uVar11 - uVar14 != 0) {
    lVar13 = uVar14 * 0x48 + 0x28;
    do {
      lVar2 = *(long *)((long)pqVar8 + lVar13 + -8);
      local_230 = &local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,lVar2,
                 *(long *)((long)&(pqVar8->tokentype)._M_dataplus._M_p + lVar13) + lVar2);
      std::__cxx11::string::append((char *)&local_230);
      std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230);
      }
      uVar14 = uVar14 + 1;
      pqVar8 = (token->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = ((long)(token->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pqVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + 0x48;
    } while (uVar14 <= uVar11 && uVar11 - uVar14 != 0);
  }
  pbVar9 = (this_00->c).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar9 != (this_00->c).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (pbVar9 == (this_00->c).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar9 = (this_00->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pcVar3 = pbVar9[-1]._M_dataplus._M_p;
      local_230 = &local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar3,pcVar3 + pbVar9[-1]._M_string_length);
      std::__cxx11::string::append((char *)&local_230);
      std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&this_00->c);
      pbVar9 = (this_00->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    } while (pbVar9 != (this_00->c).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::ofstream::ofstream(&local_230,"AnalyzeProcess.txt",_S_app);
  *(uint *)((long)alStack_218 + local_230[-3]) = *(uint *)((long)alStack_218 + local_230[-3]) | 0x20
  ;
  *(undefined8 *)((long)alStack_218 + local_230[-3] + -8) = 0x2d;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,local_250,local_248);
  local_298[0]._0_1_ = 0x7c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_298,1);
  *(undefined8 *)((long)alStack_218 + local_230[-3] + -8) = 0x28;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,local_270,local_268);
  local_298[0] = (undefined1 *)CONCAT71(local_298[0]._1_7_,0x7c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_298,1);
  *(undefined8 *)((long)alStack_218 + local_230[-3] + -8) = 0x96;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,local_2b8,local_2b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)((long)&local_230 + _VTT[-3]) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  return;
}

Assistant:

void LRGrammaticalAnalyzer::PrintStack(std::vector<quadraple> &token, int pos, std::stack<int> stateid,
                                       std::stack<std::string> symbol) {

    std::string st, tk, sym;
    while (!stateid.empty()) {
        //std::cout << stateid.top()<<' ';
        st += std::to_string(stateid.top()) + " ";
        stateid.pop();
    }


    for (int i = pos; i < token.size(); i++)
        //std::cout << token[i].attributevalue << ' ';
        tk += token[i].attributevalue + " ";


    while (!symbol.empty()) {
        //std::cout << symbol.top()<<" ";
        sym += symbol.top() + " ";
        symbol.pop();
    }

    std::ofstream analyzeout("AnalyzeProcess.txt", std::ofstream::app);

    analyzeout.setf(std::ios::left);
    analyzeout.width(45);
    analyzeout << st << '|';
    analyzeout.width(40);
    analyzeout << tk << '|';
    analyzeout.width(150);
    analyzeout << sym << std::endl;

    analyzeout.close();
}